

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[27],char_const*,char[18],char_const*>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [27],
                   char **args_1,char (*args_2) [18],char **args_3)

{
  char *pcVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char (*local_68) [27];
  size_t local_60;
  char *local_58;
  size_t local_50;
  char (*local_48) [18];
  size_t local_40;
  char *local_38;
  
  local_90._M_len = (a->View_)._M_len;
  local_90._M_str = (a->View_)._M_str;
  local_80 = (b->View_)._M_len;
  pcStack_78 = (b->View_)._M_str;
  local_70 = strlen(*args);
  pcVar1 = *args_1;
  local_68 = args;
  local_60 = strlen(pcVar1);
  local_58 = pcVar1;
  local_50 = strlen(*args_2);
  pcVar1 = *args_3;
  local_48 = args_2;
  local_40 = strlen(pcVar1);
  views._M_len = 6;
  views._M_array = &local_90;
  local_38 = pcVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}